

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Deserializer.cpp
# Opt level: O0

ControlInfo * __thiscall
adios2::format::BP5Deserializer::GetPriorControl(BP5Deserializer *this,FMFormat Format)

{
  ControlInfo *tmp;
  FMFormat Format_local;
  BP5Deserializer *this_local;
  
  tmp = this->ControlBlocks;
  while( true ) {
    if (tmp == (ControlInfo *)0x0) {
      return (ControlInfo *)0x0;
    }
    if (tmp->Format == Format) break;
    tmp = tmp->Next;
  }
  return tmp;
}

Assistant:

BP5Deserializer::ControlInfo *BP5Deserializer::GetPriorControl(FMFormat Format)
{
    struct ControlInfo *tmp = ControlBlocks;
    while (tmp)
    {
        if (tmp->Format == Format)
        {
            return tmp;
        }
        tmp = tmp->Next;
    }
    return NULL;
}